

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::internal::format_decimal<unsigned_long,wchar_t,fmt::internal::NoThousandsSep>
               (long buffer,ulong value,ulong param_3)

{
  uint uVar1;
  int *piVar2;
  long local_8;
  
  piVar2 = (int *)(buffer + (param_3 & 0xffffffff) * 4 + -4);
  for (; 99 < value; value = value / 100) {
    *piVar2 = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [(value % 100) * 2 + 1];
    piVar2[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                      [(value % 100) * 2];
    piVar2 = piVar2 + -2;
  }
  if (value < 10) {
    uVar1 = (uint)value | 0x30;
    local_8 = -4;
  }
  else {
    *piVar2 = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [((value & 0xffffffff) * 2 & 0xffffffff) + 1];
    uVar1 = (uint)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                  [(value & 0xffffffff) * 2];
    local_8 = -8;
  }
  *(uint *)((long)piVar2 + local_8 + 4) = uVar1;
  return;
}

Assistant:

inline void format_decimal(Char *buffer, UInt value, unsigned num_digits,
                           ThousandsSep thousands_sep) {
  buffer += num_digits;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = Data::DIGITS[index + 1];
    thousands_sep(buffer);
    *--buffer = Data::DIGITS[index];
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<char>('0' + value);
    return;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = Data::DIGITS[index + 1];
  thousands_sep(buffer);
  *--buffer = Data::DIGITS[index];
}